

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_ieee754_flatan1(asmcode *code,compiler_options *param_2)

{
  operand local_ac [2];
  operation local_a4 [2];
  operand local_9c [2];
  operation local_94 [2];
  operand local_8c;
  operation local_88 [3];
  operand local_7c [2];
  operation local_74;
  operand local_70 [2];
  operation local_68 [2];
  operand local_60 [2];
  operation local_58;
  operand local_54 [2];
  operation local_4c;
  uint64_t local_48;
  uint64_t header;
  operand local_38;
  operation local_34;
  unsigned_long local_30;
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = AND;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_30 = 0xfffffffffffffff8;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1c,local_24 + 1,local_24,&local_30);
  local_34 = FLD;
  local_38 = MEM_RAX;
  header._4_4_ = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_34,&local_38,(int *)((long)&header + 4));
  local_48 = make_block_header(1,T_FLONUM);
  local_4c = MOV;
  local_54[1] = 10;
  local_54[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_4c,local_54 + 1,local_54);
  local_58 = OR;
  local_60[1] = 10;
  local_60[0] = NUMBER;
  local_68[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_58,local_60 + 1,local_60,(int *)(local_68 + 1));
  local_68[0] = MOV;
  local_70[1] = 9;
  local_70[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            ((asmcode *)param_1_local,local_68,local_70 + 1,local_70,&local_48);
  local_74 = MOV;
  local_7c[1] = 0x20;
  local_7c[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_74,local_7c + 1,local_7c);
  local_88[2] = 0x17;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_88 + 2);
  local_88[1] = 0x1d;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_88 + 1);
  local_88[0] = FSTP;
  local_8c = MEM_RBP;
  local_94[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_88,&local_8c,(int *)(local_94 + 1));
  local_94[0] = ADD;
  local_9c[1] = 0x10;
  local_9c[0] = NUMBER;
  local_a4[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_94,local_9c + 1,local_9c,(int *)(local_a4 + 1));
  local_a4[0] = MOV;
  local_ac[1] = 9;
  local_ac[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_a4,local_ac + 1,local_ac);
  return;
}

Assistant:

void inline_ieee754_flatan1(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::FLD, ASM::asmcode::MEM_RAX, CELLS(1));

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FLD1);
  code.add(ASM::asmcode::FPATAN);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }